

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousCompBoundary
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  int iVar3;
  UCPTrie *trie;
  uint c;
  UChar *pUVar4;
  
  do {
    if (p == start) {
      return p;
    }
    pUVar4 = p + -1;
    UVar1 = p[-1];
    c = (uint)(ushort)UVar1;
    if ((c & 0xf800) == 0xd800) {
      if ((pUVar4 != start & (byte)((ushort)UVar1 >> 10) & 1) == 0) {
        trie = this->normTrie;
      }
      else {
        trie = this->normTrie;
        if ((p[-2] & 0xfc00U) == 0xd800) {
          pUVar4 = p + -2;
          c = c + (uint)(ushort)p[-2] * 0x400 + 0xfca02400;
          if ((int)c < trie->highStart) {
            iVar3 = ucptrie_internalSmallIndex_63(trie,c);
            trie = this->normTrie;
          }
          else {
            iVar3 = trie->dataLength + -2;
          }
          goto LAB_002968cd;
        }
      }
      iVar3 = trie->dataLength + -1;
    }
    else {
      trie = this->normTrie;
      iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
LAB_002968cd:
    uVar2 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
    if ((uVar2 & 1) != 0) {
      if (onlyContiguous == '\0') {
        return p;
      }
      if (uVar2 == 1) {
        return p;
      }
      if (uVar2 < this->limitNoNo) {
        if (*(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200) {
          return p;
        }
      }
      else if ((uVar2 & 6) < 3) {
        return p;
      }
    }
    if (c < (ushort)this->minCompNoMaybeCP) {
      return pUVar4;
    }
    if (uVar2 < this->minNoNoCompNoMaybeCC) {
      return pUVar4;
    }
    p = pUVar4;
    if ((this->limitNoNo <= uVar2) && (uVar2 < this->minMaybeYes)) {
      return pUVar4;
    }
  } while( true );
}

Assistant:

const UChar *Normalizer2Impl::findPreviousCompBoundary(const UChar *start, const UChar *p,
                                                       UBool onlyContiguous) const {
    while (p != start) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return codePointLimit;
        }
        if (hasCompBoundaryBefore(c, norm16)) {
            return p;
        }
    }
    return p;
}